

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GRouter.cpp
# Opt level: O0

int CGRouter::FilterRouting(CDesign *pDesign,CWire *pWire)

{
  int iVar1;
  CNet *pCVar2;
  CNet *pNet;
  CWire *pWire_local;
  CDesign *pDesign_local;
  
  if (pWire != (CWire *)0x0) {
    iVar1 = CWire::IsCompleted(pWire);
    if (iVar1 == 0) {
      pCVar2 = CWire::GetParent(pWire);
      if (pCVar2 == (CNet *)0x0) {
        pDesign_local._4_4_ = 1;
      }
      else {
        CNet::SplitWire(pCVar2);
        pCVar2 = CWire::GetParent(pWire);
        if (pCVar2 == (CNet *)0x0) {
          pDesign_local._4_4_ = 1;
        }
        else {
          iVar1 = CWire::IsCompleted(pWire);
          if (iVar1 == 0) {
            iVar1 = CNet::IsConnected(pCVar2,pWire->m_pPointS,pWire->m_pPointE);
            if (iVar1 == 0) {
              pDesign_local._4_4_ = 0;
            }
            else {
              CNet::DelWire(pCVar2,pWire,0);
              CNet::Refine(pCVar2);
              CWire::Delete(pWire);
              pDesign_local._4_4_ = 1;
            }
          }
          else {
            pDesign_local._4_4_ = 1;
          }
        }
      }
    }
    else {
      pDesign_local._4_4_ = 1;
    }
    return pDesign_local._4_4_;
  }
  __assert_fail("pWire",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Apodead[P]BoxRouter/br_64bit_release/GRouter.cpp"
                ,0x6cd,"static int CGRouter::FilterRouting(CDesign *, CWire *)");
}

Assistant:

int CGRouter::FilterRouting(CDesign* pDesign, CWire* pWire)
{
	assert(pWire);
	
	if(pWire->IsCompleted())	
	{
		return	TRUE;
	}
	
	CNet*	pNet	=	pWire->GetParent();
	// it is deleted from the net [7/1/2006 thyeros]
	if(pNet==NULL)	return	TRUE;

	pNet->SplitWire();
	pNet	=	pWire->GetParent();
	
	// it is deleted from the net [7/1/2006 thyeros]
	if(pNet==NULL)	return	TRUE;
	if(pWire->IsCompleted())		return	TRUE;
	
	if(pNet->IsConnected(pWire->m_pPointS,pWire->m_pPointE))
	{
		pNet->DelWire(pWire);
		pNet->Refine();

		pWire->Delete();//SAFE_DEL(pWire);

		return	TRUE;
	}

	return	FALSE;
}